

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *pcVar1;
  bool bVar2;
  string *psVar3;
  reference pbVar4;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *this_01;
  reference ppcVar5;
  ostream *poVar6;
  cmSourceFile *src;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string *obj_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  string *obj;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmGeneratedFileStream fout;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  const_iterator local_118;
  string local_110;
  string local_f0;
  undefined1 local_d0 [8];
  string objlist_file;
  string local_90;
  string local_60;
  undefined1 local_40 [8];
  string cmd;
  ModuleDefinitionInfo *mdi;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *real_link_commands_local;
  cmMakefileTargetGenerator *this_local;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  psVar3 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_(&this->super_cmCommonTargetGenerator);
  cmd.field_2._8_8_ = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,psVar3);
  if (((ModuleDefinitionInfo *)cmd.field_2._8_8_ != (ModuleDefinitionInfo *)0x0) &&
     ((((ModuleDefinitionInfo *)cmd.field_2._8_8_)->DefFileGenerated & 1U) != 0)) {
    psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    std::__cxx11::string::string((string *)local_40,(string *)psVar3);
    cmOutputConverter::ConvertToOutputFormat
              (&local_60,
               &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)local_40,SHELL);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::operator+=((string *)local_40," -E __create_def ");
    pcVar1 = this->LocalGenerator;
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              ((string *)((long)&objlist_file.field_2 + 8),(cmLocalGenerator *)pcVar1,psVar3,
               (string *)cmd.field_2._8_8_);
    cmOutputConverter::ConvertToOutputFormat
              (&local_90,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,(string *)((long)&objlist_file.field_2 + 8),SHELL);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)(objlist_file.field_2._M_local_buf + 8));
    std::__cxx11::string::operator+=((string *)local_40," ");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   cmd.field_2._8_8_,".objs");
    pcVar1 = this->LocalGenerator;
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)pcVar1);
    cmLocalGenerator::MaybeConvertToRelativePath
              (&local_110,(cmLocalGenerator *)pcVar1,psVar3,(string *)local_d0);
    cmOutputConverter::ConvertToOutputFormat
              (&local_f0,
               &(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_110,SHELL);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    local_120._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(real_link_commands);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_118,&local_120);
    fout._576_8_ = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::insert(real_link_commands,local_118,(value_type *)local_40);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)&__range2,(string *)local_d0,false,None);
    if ((*(byte *)(cmd.field_2._8_8_ + 0x21) & 1) != 0) {
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->Objects);
      obj = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->Objects);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&obj), bVar2) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        bVar2 = cmHasLiteralSuffix<std::__cxx11::string,5ul>(pbVar4,(char (*) [5])".obj");
        if (bVar2) {
          poVar6 = std::operator<<((ostream *)&__range2,(string *)pbVar4);
          std::operator<<(poVar6,"\n");
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->ExternalObjects);
      obj_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->ExternalObjects);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&obj_1), bVar2) {
        pbVar4 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2_1);
        poVar6 = std::operator<<((ostream *)&__range2,(string *)pbVar4);
        std::operator<<(poVar6,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2_1);
      }
    }
    this_01 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
              (cmd.field_2._8_8_ + 0x28);
    __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       (this_01);
    src = (cmSourceFile *)
          std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                       *)&src), bVar2) {
      ppcVar5 = __gnu_cxx::
                __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                ::operator*(&__end1);
      psVar3 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar5);
      poVar6 = std::operator<<((ostream *)&__range2,(string *)psVar3);
      std::operator<<(poVar6,"\n");
      __gnu_cxx::
      __normal_iterator<const_cmSourceFile_*const_*,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
      ::operator++(&__end1);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&__range2);
    std::__cxx11::string::~string((string *)local_d0);
    std::__cxx11::string::~string((string *)local_40);
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd =
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
  cmd += " -E __create_def ";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), mdi->DefFile),
    cmOutputConverter::SHELL);
  cmd += " ";
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeConvertToRelativePath(
      this->LocalGenerator->GetCurrentBinaryDirectory(), objlist_file),
    cmOutputConverter::SHELL);
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}